

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_bitmaps_contains_benchmark.c
# Opt level: O0

roaring_bitmap_t **
create_all_bitmaps(size_t *howmany,uint32_t **numbers,size_t count,_Bool runoptimize,
                  _Bool copy_on_write)

{
  roaring_bitmap_t *prVar1;
  byte in_CL;
  roaring_bitmap_t *in_RDX;
  long in_RSI;
  byte in_R8B;
  size_t i;
  roaring_bitmap_t **answer;
  roaring_bitmap_t *vals;
  roaring_bitmap_t **local_8;
  
  if (in_RSI == 0) {
    local_8 = (roaring_bitmap_t **)0x0;
  }
  else {
    printf("Constructing %d  bitmaps.\n",(ulong)in_RDX & 0xffffffff);
    local_8 = (roaring_bitmap_t **)malloc((long)in_RDX << 3);
    for (vals = (roaring_bitmap_t *)0x0; vals < in_RDX;
        vals = (roaring_bitmap_t *)((long)&(vals->high_low_container).size + 1)) {
      printf(".");
      fflush(_stdout);
      prVar1 = roaring_bitmap_of_ptr((size_t)local_8,(uint32_t *)vals);
      local_8[(long)vals] = prVar1;
      if ((in_CL & 1) != 0) {
        roaring_bitmap_run_optimize(in_RDX);
      }
      roaring_bitmap_shrink_to_fit(in_RDX);
      roaring_bitmap_set_copy_on_write(local_8[(long)vals],(_Bool)(in_R8B & 1));
    }
    printf("\n");
  }
  return local_8;
}

Assistant:

static roaring_bitmap_t **create_all_bitmaps(size_t *howmany,
                                             uint32_t **numbers, size_t count,
                                             bool runoptimize,
                                             bool copy_on_write) {
    if (numbers == NULL) return NULL;
    printf("Constructing %d  bitmaps.\n", (int)count);
    roaring_bitmap_t **answer = malloc(sizeof(roaring_bitmap_t *) * count);
    for (size_t i = 0; i < count; i++) {
        printf(".");
        fflush(stdout);
        answer[i] = roaring_bitmap_of_ptr(howmany[i], numbers[i]);
        if (runoptimize) roaring_bitmap_run_optimize(answer[i]);
        roaring_bitmap_shrink_to_fit(answer[i]);
        roaring_bitmap_set_copy_on_write(answer[i], copy_on_write);
    }
    printf("\n");
    return answer;
}